

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestPipelineImpl::getCap(TestPipelineImpl *this,GetCapContext context)

{
  CapTableBuilder *pCVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  RequestHook *pRVar5;
  TransformPromiseNodeBase *this_00;
  CapTableReader *__n;
  Disposer *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  PromiseNode *pPVar6;
  int in_R8D;
  bool bVar7;
  Promise<void> PVar8;
  Client cap;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Reader params;
  undefined1 local_f8 [16];
  undefined8 uStack_e8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_e0;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_a8;
  StructReader local_70;
  Maybe<capnp::MessageSize> local_40;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**in_RDX->_vptr_Disposer)(&local_e0);
  local_a8.super_Builder._builder.segment._4_4_ = local_e0.super_Builder._builder.segment._4_4_;
  local_a8.super_Builder._builder.data = local_e0.super_Builder._builder.data;
  local_a8.super_Builder._builder.pointers = local_e0.super_Builder._builder.pointers;
  local_a8.super_Builder._builder.capTable = local_e0.super_Builder._builder.capTable;
  PointerReader::getStruct(&local_70,(PointerReader *)&local_a8,(word *)0x0);
  bVar7 = true;
  if (0x1f < local_70.dataSize) {
    bVar7 = *local_70.data != 0xea;
  }
  if ((bVar7) && (kj::_::Debug::minSeverity < 3)) {
    local_e0.super_Builder._builder.segment._0_4_ = 0;
    local_a8.super_Builder._builder.segment =
         (SegmentBuilder *)CONCAT44(local_a8.super_Builder._builder.segment._4_4_,0xea);
    if (0x1f < local_70.dataSize) {
      local_e0.super_Builder._builder.segment._0_4_ = *local_70.data;
    }
    in_R8D = 0x2e18d1;
    kj::_::Debug::log<char_const(&)[42],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x3a8,ERROR,"\"failed: expected \" \"(234) == (params.getN())\", 234, params.getN()"
               ,(char (*) [42])"failed: expected (234) == (params.getN())",(int *)&local_a8,
               (uint *)&local_e0);
  }
  __n = local_70.capTable;
  if (local_70.pointerCount == 0) {
    local_70.nestingLimit = 0x7fffffff;
    local_70.pointers = (WirePointer *)0x0;
    local_70.segment = (SegmentReader *)0x0;
    __n = (CapTableReader *)0x0;
  }
  local_a8.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_a8.super_Builder._builder.pointers._4_4_,local_70.nestingLimit)
  ;
  local_a8.super_Builder._builder.segment = (SegmentBuilder *)local_70.segment;
  local_a8.super_Builder._builder.capTable = (CapTableBuilder *)__n;
  local_a8.super_Builder._builder.data = local_70.pointers;
  PointerReader::getCapability((PointerReader *)&local_e0);
  local_f8._8_4_ = (int)local_e0.super_Builder._builder.segment;
  local_f8._12_4_ = local_e0.super_Builder._builder.segment._4_4_;
  uStack_e8 = local_e0.super_Builder._builder.capTable;
  local_f8._0_8_ = &Capability::Client::typeinfo;
  (*in_RDX->_vptr_Disposer[1])();
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_a8,(Client *)local_f8,&local_40);
  ((WireValue<uint32_t> *)local_a8.super_Builder._builder.data)->value = 0x7b;
  *(byte *)((long)local_a8.super_Builder._builder.data + 4) =
       *(byte *)((long)local_a8.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_e0,(int)&local_a8,__buf,(size_t)__n,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_e0,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:946:7),_kj::_::PropagateException>
             ::anon_class_16_2_06e2585c_for_func::operator());
  pDVar4 = local_e0.hook.disposer;
  uVar3 = local_e0.super_Builder._builder._32_8_;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00376010;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)context.hook;
  this_00[1].dependency.disposer = in_RDX;
  (this->super_Server)._vptr_Server =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestPipelineImpl::getCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,capnproto_test::capnp::test::TestPipeline::GetCapResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
  pPVar6 = extraout_RDX;
  if (local_e0.super_Builder._builder._32_8_ != 0) {
    local_e0.super_Builder._builder.dataSize = 0;
    local_e0.super_Builder._builder.pointerCount = 0;
    local_e0.super_Builder._builder._38_2_ = 0;
    local_e0.hook.disposer = (Disposer *)0x0;
    (**(local_e0.hook.ptr)->_vptr_RequestHook)(local_e0.hook.ptr,uVar3,8,pDVar4,pDVar4,0);
    pPVar6 = extraout_RDX_00;
  }
  pWVar2 = local_e0.super_Builder._builder.pointers;
  if (local_e0.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_e0.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_e0.super_Builder._builder.data)
              (local_e0.super_Builder._builder.data,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
    pPVar6 = extraout_RDX_01;
  }
  pCVar1 = local_e0.super_Builder._builder.capTable;
  if (local_e0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_e0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_e0.super_Builder._builder.segment._4_4_,
                         (int)local_e0.super_Builder._builder.segment))
              ((undefined8 *)
               CONCAT44(local_e0.super_Builder._builder.segment._4_4_,
                        (int)local_e0.super_Builder._builder.segment),
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar1->super_CapTableReader);
    pPVar6 = extraout_RDX_02;
  }
  pRVar5 = local_a8.hook.ptr;
  if (local_a8.hook.ptr != (RequestHook *)0x0) {
    local_a8.hook.ptr = (RequestHook *)0x0;
    (**(local_a8.hook.disposer)->_vptr_Disposer)
              (local_a8.hook.disposer,
               pRVar5->_vptr_RequestHook[-2] + (long)&pRVar5->_vptr_RequestHook);
    pPVar6 = extraout_RDX_03;
  }
  pCVar1 = uStack_e8;
  if (uStack_e8 != (CapTableBuilder *)0x0) {
    uStack_e8 = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_f8._12_4_,local_f8._8_4_))
              ((undefined8 *)CONCAT44(local_f8._12_4_,local_f8._8_4_),
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar1->super_CapTableReader);
    pPVar6 = extraout_RDX_04;
  }
  PVar8.super_PromiseBase.node.ptr = pPVar6;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar8.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestPipelineImpl::getCap(GetCapContext context) {
  ++callCount;

  auto params = context.getParams();
  EXPECT_EQ(234, params.getN());

  auto cap = params.getInCap();
  context.releaseParams();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  return request.send().then(
      [this,KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());

        auto result = context.getResults();
        result.setS("bar");
        result.initOutBox().setCap(kj::heap<TestExtendsImpl>(callCount));
      }